

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O0

schar fillholetyp(int x,int y)

{
  int iVar1;
  int iVar2;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int swamp_cnt;
  int lava_cnt;
  int moat_cnt;
  int pool_cnt;
  int hi_y;
  int lo_y;
  int hi_x;
  int lo_x;
  int y1;
  int x1;
  int y_local;
  int x_local;
  
  if (x + -1 < 1) {
    local_40 = 1;
  }
  else {
    local_40 = x + -1;
  }
  if (x + 1 < 0x4f) {
    local_44 = x + 1;
  }
  else {
    local_44 = 0x4f;
  }
  if (y + -1 < 0) {
    local_48 = 0;
  }
  else {
    local_48 = y + -1;
  }
  if (y + 1 < 0x14) {
    local_4c = y + 1;
  }
  else {
    local_4c = 0x14;
  }
  lava_cnt = 0;
  swamp_cnt = 0;
  local_38 = 0;
  local_3c = 0;
  for (lo_x = local_40; lo_x <= local_44; lo_x = lo_x + 1) {
    for (hi_x = local_48; hi_x <= local_4c; hi_x = hi_x + 1) {
      if (level->locations[lo_x][hi_x].typ == '\x11') {
        lava_cnt = lava_cnt + 1;
      }
      else if ((level->locations[lo_x][hi_x].typ == '\x12') ||
              ((level->locations[lo_x][hi_x].typ == '\x14' &&
               ((*(uint *)&level->locations[lo_x][hi_x].field_0x6 >> 4 & 0x1c) == 0)))) {
        swamp_cnt = swamp_cnt + 1;
      }
      else if ((level->locations[lo_x][hi_x].typ == '\x15') ||
              ((level->locations[lo_x][hi_x].typ == '\x14' &&
               ((*(uint *)&level->locations[lo_x][hi_x].field_0x6 >> 4 & 0x1c) == 4)))) {
        local_38 = local_38 + 1;
      }
      else if ((level->locations[lo_x][hi_x].typ == '#') ||
              ((level->locations[lo_x][hi_x].typ == '\x14' &&
               ((*(uint *)&level->locations[lo_x][hi_x].field_0x6 >> 4 & 0x1c) == 0x10)))) {
        local_3c = local_3c + 1;
      }
    }
  }
  iVar1 = lava_cnt / 3;
  if ((swamp_cnt + iVar1 < local_38) && (iVar2 = rn2(local_38 + 1), iVar2 != 0)) {
    y_local._3_1_ = '\x15';
  }
  else if ((swamp_cnt < 1) || (iVar2 = rn2(swamp_cnt + 1), iVar2 == 0)) {
    if ((iVar1 < 1) || (iVar1 = rn2(iVar1 + 1), iVar1 == 0)) {
      if ((local_3c < 1) || (iVar1 = rn2(local_3c + 1), iVar1 == 0)) {
        y_local._3_1_ = '\x19';
      }
      else {
        y_local._3_1_ = '#';
      }
    }
    else {
      y_local._3_1_ = '\x11';
    }
  }
  else {
    y_local._3_1_ = '\x12';
  }
  return y_local._3_1_;
}

Assistant:

schar fillholetyp(int x, int y)
{
    int x1, y1;
    int lo_x = max(1,x-1), hi_x = min(x+1,COLNO-1),
	lo_y = max(0,y-1), hi_y = min(y+1,ROWNO-1);
    int pool_cnt = 0, moat_cnt = 0, lava_cnt = 0, swamp_cnt = 0;

    /* count the terrain types at and around x,y including those under drawbridges */
    for (x1 = lo_x; x1 <= hi_x; x1++)
	for (y1 = lo_y; y1 <= hi_y; y1++)
	    if (level->locations[x1][y1].typ == POOL)
		pool_cnt++;
	    else if (level->locations[x1][y1].typ == MOAT ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_MOAT))
		moat_cnt++;
	    else if (level->locations[x1][y1].typ == LAVAPOOL ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_LAVA))
		lava_cnt++;
	    else if (level->locations[x1][y1].typ == BOG ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_BOG))
		swamp_cnt++;
    pool_cnt /= 3;		/* not as much liquid as the others */

    if (lava_cnt > moat_cnt + pool_cnt && rn2(lava_cnt + 1))
	return LAVAPOOL;
    else if (moat_cnt > 0 && rn2(moat_cnt + 1))
	return MOAT;
    else if (pool_cnt > 0 && rn2(pool_cnt + 1))
	return POOL;
    else if (swamp_cnt > 0 && rn2(swamp_cnt + 1))
	return BOG;
    else
	return ROOM;
}